

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_14(QPDF *pdf,char *arg2)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  int iVar2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__x;
  long lVar3;
  QPDFObjGen QVar4;
  element_type *peVar5;
  ostream *poVar6;
  Buffer *this_00;
  FILE *__s;
  void *__ptr;
  size_t __size;
  logic_error *this_01;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  QPDFObjectHandle QVar11;
  QPDFObjectHandle QVar12;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  dict_items;
  string filename;
  value_type orig_page3;
  value_type orig_page2;
  QPDFObjectHandle new_dict;
  QPDFObjectHandle qarray;
  QPDFWriter w;
  QPDFObjectHandle trailer;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> array_elements;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> pages;
  undefined1 local_158 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_150;
  _Base_ptr local_148 [3];
  size_t local_130;
  long *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  long local_118 [2];
  element_type *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  QPDFObjGen local_f8;
  element_type *local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  element_type *local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  undefined8 local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  string local_c0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  key_type local_b0;
  undefined8 local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  undefined8 local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_60;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_48;
  
  local_f8 = (QPDFObjGen)pdf;
  __x = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&local_48,__x);
  if ((long)local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
            .super__Vector_impl_data._M_start != 0x40) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"test 14 not called 4-page file");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_e0 = local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_start[1].super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_d8 = local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_start[1].super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_d8->_M_use_count = local_d8->_M_use_count + 1;
      UNLOCK();
      if ((ulong)((long)local_48.
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 4) < 3) {
        uVar7 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,2);
        if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
        }
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_48);
        _Unwind_Resume(uVar7);
      }
    }
    else {
      local_d8->_M_use_count = local_d8->_M_use_count + 1;
    }
  }
  local_f0 = local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_start[2].super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_e8 = local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_start[2].super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_e8->_M_use_count = local_e8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_e8->_M_use_count = local_e8->_M_use_count + 1;
    }
  }
  local_158 = (undefined1  [8])local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/OrigPage","");
  QPDFObjectHandle::getKey((string *)&local_128);
  lVar3 = QPDFObjectHandle::getIntValue();
  if (lVar3 != 2) {
    __assert_fail("orig_page2.getKey(\"/OrigPage\").getIntValue() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,600,"void test_14(QPDF &, const char *)");
  }
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
  }
  if (local_158 != (undefined1  [8])local_148) {
    operator_delete((void *)local_158,(ulong)((long)&local_148[0]->_M_color + 1));
  }
  local_158 = (undefined1  [8])local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/OrigPage","");
  QPDFObjectHandle::getKey((string *)&local_128);
  lVar3 = QPDFObjectHandle::getIntValue();
  if (lVar3 != 3) {
    __assert_fail("orig_page3.getKey(\"/OrigPage\").getIntValue() == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x259,"void test_14(QPDF &, const char *)");
  }
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
  }
  if (local_158 != (undefined1  [8])local_148) {
    operator_delete((void *)local_158,(ulong)((long)&local_148[0]->_M_color + 1));
  }
  QVar4 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  QPDFObjectHandle::getObjGen();
  QPDF::swapObjects(local_f8,QVar4);
  local_158 = (undefined1  [8])local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/OrigPage","");
  QPDFObjectHandle::getKey((string *)&local_128);
  lVar3 = QPDFObjectHandle::getIntValue();
  if (lVar3 != 3) {
    __assert_fail("orig_page2.getKey(\"/OrigPage\").getIntValue() == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x25b,"void test_14(QPDF &, const char *)");
  }
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
  }
  if (local_158 != (undefined1  [8])local_148) {
    operator_delete((void *)local_158,(ulong)((long)&local_148[0]->_M_color + 1));
  }
  local_158 = (undefined1  [8])local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/OrigPage","");
  QPDFObjectHandle::getKey((string *)&local_128);
  lVar3 = QPDFObjectHandle::getIntValue();
  if (lVar3 == 2) {
    if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
    }
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,(ulong)((long)&local_148[0]->_M_color + 1));
    }
    QPDF::getTrailer();
    local_158 = (undefined1  [8])local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/QDict","");
    QPDFObjectHandle::getKey((string *)&local_108);
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,(ulong)((long)&local_148[0]->_M_color + 1));
    }
    local_158 = (undefined1  [8])local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/QArray","");
    QPDFObjectHandle::getKey(local_c0);
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,(ulong)((long)&local_148[0]->_M_color + 1));
    }
    QPDFObjectHandle::isDictionary();
    QPDFObjectHandle::newDictionary();
    local_158 = (undefined1  [8])local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/NewDict","");
    QPDFObjectHandle::newInteger((longlong)&local_128);
    QPDFObjectHandle::replaceKey((string *)&local_d0,(QPDFObjectHandle *)local_158);
    if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
    }
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,(ulong)((long)&local_148[0]->_M_color + 1));
    }
    peVar5 = (element_type *)QPDFObjectHandle::getObjGen();
    local_80 = local_108;
    local_78 = p_Stack_100;
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Stack_100->_M_use_count = p_Stack_100->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Stack_100->_M_use_count = p_Stack_100->_M_use_count + 1;
      }
    }
    QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_80;
    QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar5;
    QPDF::replaceObject(local_f8,QVar11);
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
    peVar5 = (element_type *)QPDFObjectHandle::getObjGen();
    local_90 = local_d0;
    local_88 = local_c8;
    if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_c8->_M_use_count = local_c8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_c8->_M_use_count = local_c8->_M_use_count + 1;
      }
    }
    QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_90;
    QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar5;
    QPDF::replaceObject(local_f8,QVar12);
    if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"old dict: ",10);
    local_158 = (undefined1  [8])local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/NewDict","");
    QPDFObjectHandle::getKey((string *)&local_128);
    QPDFObjectHandle::getIntValue();
    poVar6 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
    }
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,(ulong)((long)&local_148[0]->_M_color + 1));
    }
    QVar4 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
    QPDFObjectHandle::getObjGen();
    QPDF::swapObjects(local_f8,QVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"swapped array: ",0xf);
    QPDFObjectHandle::getArrayItem((int)&local_128);
    QPDFObjectHandle::getName_abi_cxx11_();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_158,(long)_Stack_150._M_pi);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,(ulong)((long)&local_148[0]->_M_color + 1));
    }
    if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"new dict: ",10);
    local_158 = (undefined1  [8])local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/NewDict","");
    QPDFObjectHandle::getKey((string *)&local_128);
    QPDFObjectHandle::getIntValue();
    poVar6 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
    }
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,(ulong)((long)&local_148[0]->_M_color + 1));
    }
    QPDFObjectHandle::getObjGen();
    QPDF::getObjectByObjGen((QPDFObjGen)local_158);
    this = p_Stack_100;
    p_Stack_100 = _Stack_150._M_pi;
    local_108 = (element_type *)local_158;
    local_158 = (undefined1  [8])0x0;
    _Stack_150._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      if (_Stack_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_150._M_pi);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"swapped array: ",0xf);
    QPDFObjectHandle::getArrayItem((int)&local_128);
    QPDFObjectHandle::getName_abi_cxx11_();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_158,(long)_Stack_150._M_pi);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,(ulong)((long)&local_148[0]->_M_color + 1));
    }
    if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
    }
    QPDFObjectHandle::getArrayAsVector();
    QPDFObjectHandle::getDictAsMap_abi_cxx11_();
    if ((long)local_60.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_60.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x10) {
      QPDFObjectHandle::getName_abi_cxx11_();
      iVar2 = std::__cxx11::string::compare((char *)&local_128);
      bVar10 = false;
      if ((iVar2 == 0) && (bVar10 = false, local_130 == 1)) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/NewDict","");
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                      *)local_158,&local_b0);
        lVar3 = QPDFObjectHandle::getIntValue();
        bVar10 = lVar3 == 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_128 != local_118) {
        operator_delete(local_128,local_118[0] + 1);
      }
      if (bVar10) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"array and dictionary contents are correct",0x29);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
      }
    }
    bVar10 = true;
    do {
      bVar1 = bVar10;
      QPDFWriter::QPDFWriter((QPDFWriter *)&local_b0,(QPDF *)local_f8);
      QPDFWriter::setOutputMemory();
      QPDFWriter::setStaticID(SUB81(&local_b0,0));
      QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&local_b0);
      QPDFWriter::write();
      this_00 = (Buffer *)QPDFWriter::getBuffer();
      pcVar9 = "b.pdf";
      if (bVar1) {
        pcVar9 = "a.pdf";
      }
      pcVar8 = "";
      if (bVar1) {
        pcVar8 = "";
      }
      local_128 = local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,pcVar9,pcVar8);
      __s = (FILE *)QUtil::safe_fopen((char *)local_128,"wb");
      __ptr = (void *)Buffer::getBuffer();
      __size = Buffer::getSize();
      fwrite(__ptr,__size,1,__s);
      fclose(__s);
      Buffer::~Buffer(this_00);
      operator_delete(this_00,8);
      if (local_128 != local_118) {
        operator_delete(local_128,local_118[0] + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length);
      }
      bVar10 = false;
    } while (bVar1);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                 *)local_158);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_60);
    if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
    }
    if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
    }
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
    }
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
    if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
    }
    if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_48);
    return;
  }
  __assert_fail("orig_page3.getKey(\"/OrigPage\").getIntValue() == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0x25c,"void test_14(QPDF &, const char *)");
}

Assistant:

static void
test_14(QPDF& pdf, char const* arg2)
{
    // Exercise swap and replace.  This test case is designed for
    // a specific file.
    std::vector<QPDFObjectHandle> pages = pdf.getAllPages();
    if (pages.size() != 4) {
        throw std::logic_error("test 14 not called 4-page file");
    }
    // Swap pages 2 and 3
    auto orig_page2 = pages.at(1);
    auto orig_page3 = pages.at(2);
    assert(orig_page2.getKey("/OrigPage").getIntValue() == 2);
    assert(orig_page3.getKey("/OrigPage").getIntValue() == 3);
    pdf.swapObjects(orig_page2.getObjGen(), orig_page3.getObjGen());
    assert(orig_page2.getKey("/OrigPage").getIntValue() == 3);
    assert(orig_page3.getKey("/OrigPage").getIntValue() == 2);
    // Replace object and swap objects
    QPDFObjectHandle trailer = pdf.getTrailer();
    QPDFObjectHandle qdict = trailer.getKey("/QDict");
    QPDFObjectHandle qarray = trailer.getKey("/QArray");
    // Force qdict but not qarray to resolve
    qdict.isDictionary();
    QPDFObjectHandle new_dict = QPDFObjectHandle::newDictionary();
    new_dict.replaceKey("/NewDict", QPDFObjectHandle::newInteger(2));
    try {
        // Do it wrong first...
        pdf.replaceObject(qdict.getObjGen(), qdict);
    } catch (std::logic_error const&) {
        std::cout << "caught logic error as expected" << std::endl;
    }
    pdf.replaceObject(qdict.getObjGen(), new_dict);
    // Now qdict points to the new dictionary
    std::cout << "old dict: " << qdict.getKey("/NewDict").getIntValue() << std::endl;
    // Swap dict and array
    pdf.swapObjects(qdict.getObjGen(), qarray.getObjGen());
    // Now qarray will resolve to new object and qdict resolves to
    // the array
    std::cout << "swapped array: " << qdict.getArrayItem(0).getName() << std::endl;
    std::cout << "new dict: " << qarray.getKey("/NewDict").getIntValue() << std::endl;
    // Reread qdict, still pointing to an array
    qdict = pdf.getObjectByObjGen(qdict.getObjGen());
    std::cout << "swapped array: " << qdict.getArrayItem(0).getName() << std::endl;

    // Exercise getAsMap and getAsArray
    std::vector<QPDFObjectHandle> array_elements = qdict.getArrayAsVector();
    std::map<std::string, QPDFObjectHandle> dict_items = qarray.getDictAsMap();
    if ((array_elements.size() == 1) && (array_elements.at(0).getName() == "/Array") &&
        (dict_items.size() == 1) && (dict_items["/NewDict"].getIntValue() == 2)) {
        std::cout << "array and dictionary contents are correct" << std::endl;
    }

    // Exercise writing to memory buffer
    for (int i = 0; i < 2; ++i) {
        QPDFWriter w(pdf);
        w.setOutputMemory();
        // Exercise setOutputMemory with and without static ID
        w.setStaticID(i == 0);
        w.setStreamDataMode(qpdf_s_preserve);
        w.write();
        Buffer* b = w.getBuffer();
        std::string const filename = (i == 0 ? "a.pdf" : "b.pdf");
        FILE* f = QUtil::safe_fopen(filename.c_str(), "wb");
        fwrite(b->getBuffer(), b->getSize(), 1, f);
        fclose(f);
        delete b;
    }
}